

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep.c
# Opt level: O0

nsync_time nsync_time_sleep(nsync_time delay)

{
  int iVar1;
  undefined1 local_38 [8];
  timespec ts;
  nsync_time delay_local;
  timespec remain;
  
  delay_local.tv_sec = delay.tv_nsec;
  ts.tv_nsec = delay.tv_sec;
  memset(local_38,0,0x10);
  local_38 = (undefined1  [8])ts.tv_nsec;
  ts.tv_sec = delay_local.tv_sec;
  iVar1 = nanosleep((timespec *)local_38,(timespec *)&delay_local.tv_nsec);
  if (iVar1 == 0) {
    memset(&delay_local.tv_nsec,0,0x10);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

nsync_time nsync_time_sleep (nsync_time delay) {
	struct timespec ts;
	struct timespec remain;
	memset (&ts, 0, sizeof (ts));
	ts.tv_sec = NSYNC_TIME_SEC (delay);
	ts.tv_nsec = NSYNC_TIME_NSEC (delay);
	if (nanosleep (&ts, &remain) == 0) {
		/* nanosleep() is not required to fill in "remain"
		   if it returns 0. */
		memset (&remain, 0, sizeof (remain));
	}
	return (remain);
}